

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_interp.c
# Opt level: O0

realtype LBasisD3(ARKInterp I,int j,realtype t)

{
  realtype s;
  realtype r;
  realtype q;
  realtype p;
  int m;
  int l;
  int k;
  int i;
  realtype t_local;
  int j_local;
  ARKInterp I_local;
  
  p = 0.0;
  for (m = 0; m < *(int *)((long)I->content + 0x18); m = m + 1) {
    if (m != j) {
      q = 0.0;
      for (l = 0; l < *(int *)((long)I->content + 0x18); l = l + 1) {
        if ((l != j) && (l != m)) {
          r = 0.0;
          for (i = 0; i < *(int *)((long)I->content + 0x18); i = i + 1) {
            if (((i != j) && (i != m)) && (i != l)) {
              s = 1.0;
              for (k = 0; k < *(int *)((long)I->content + 0x18); k = k + 1) {
                if (((k != j) && (k != m)) && ((k != l && (k != i)))) {
                  s = ((t - *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8)) /
                      (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
                      *(double *)(*(long *)((long)I->content + 0x10) + (long)k * 8))) * s;
                }
              }
              r = s / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
                      *(double *)(*(long *)((long)I->content + 0x10) + (long)i * 8)) + r;
            }
          }
          q = r / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
                  *(double *)(*(long *)((long)I->content + 0x10) + (long)l * 8)) + q;
        }
      }
      p = q / (*(double *)(*(long *)((long)I->content + 0x10) + (long)j * 8) -
              *(double *)(*(long *)((long)I->content + 0x10) + (long)m * 8)) + p;
    }
  }
  return p;
}

Assistant:

realtype LBasisD3(ARKInterp I, int j, realtype t)
{
  int i, k, l, m;
  realtype p, q, r, s;
  p = ZERO;
  for (m=0; m<LINT_NHIST(I); m++) {
    if (m == j) continue;
    q = ZERO;
    for (l=0; l<LINT_NHIST(I); l++) {
      if (l == j) continue;
      if (l == m) continue;
      r = ZERO;
      for (i=0; i<LINT_NHIST(I); i++) {
        if (i == j) continue;
        if (i == m) continue;
        if (i == l) continue;
        s = ONE;
        for (k=0; k<LINT_NHIST(I); k++) {
          if (k == j) continue;
          if (k == m) continue;
          if (k == l) continue;
          if (k == i) continue;
          s *= (t-LINT_TJ(I,k))/(LINT_TJ(I,j)-LINT_TJ(I,k));
        }
        r += s/(LINT_TJ(I,j)-LINT_TJ(I,i));
      }
      q += r/(LINT_TJ(I,j)-LINT_TJ(I,l));
    }
    p += q/(LINT_TJ(I,j)-LINT_TJ(I,m));
  }

  return(p);
}